

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::CommonEdgeCase::CommonEdgeCase
          (CommonEdgeCase *this,Context *context,char *name,char *description,CaseType caseType,
          int numFboSamples)

{
  int iVar1;
  int iVar2;
  FboParams local_24;
  
  iVar2 = 0x20;
  if (caseType == CASETYPE_SMALL_QUADS) {
    iVar2 = 0x80;
  }
  local_24.useFbo = -1 < numFboSamples;
  local_24.numSamples = -1;
  if (local_24.useFbo) {
    local_24.numSamples = numFboSamples;
  }
  local_24.useDepth = false;
  local_24.useStencil = false;
  MultisampleCase::MultisampleCase
            (&this->super_MultisampleCase,context,name,description,iVar2,&local_24);
  (this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0214a828;
  this->m_caseType = caseType;
  if (caseType == CASETYPE_SMALL_QUADS) {
    iVar1 = tcu::CommandLine::getTestIterationCount
                      (((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
    iVar2 = 0x10;
  }
  else {
    iVar2 = 8;
    if (caseType != CASETYPE_BIGGER_THAN_VIEWPORT_QUAD) goto LAB_011f9acb;
    iVar1 = tcu::CommandLine::getTestIterationCount
                      (((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
    iVar2 = 0x40;
  }
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
LAB_011f9acb:
  this->m_numIterations = iVar2;
  this->m_currentIteration = 0;
  return;
}

Assistant:

CommonEdgeCase::CommonEdgeCase (Context& context, const char* name, const char* description, CaseType caseType, int numFboSamples)
	: MultisampleCase		(context, name, description, caseType == CASETYPE_SMALL_QUADS ? 128 : 32, numFboSamples >= 0 ? FboParams(numFboSamples, false, false) : FboParams())
	, m_caseType			(caseType)
	, m_numIterations		(caseType == CASETYPE_SMALL_QUADS					? getIterationCount(m_testCtx, DEFAULT_SMALL_QUADS_ITERATIONS)
							: caseType == CASETYPE_BIGGER_THAN_VIEWPORT_QUAD	? getIterationCount(m_testCtx, DEFAULT_BIGGER_THAN_VIEWPORT_QUAD_ITERATIONS)
							: 8)
	, m_currentIteration	(0)
{
}